

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

Bit16s __thiscall MT32Emu::LA32IntPartialPair::nextOutSample(LA32IntPartialPair *this)

{
  bool bVar1;
  ushort uVar2;
  Bit16u BVar3;
  Bit16s BVar4;
  ushort uVar5;
  short sVar6;
  LogSample LVar8;
  ushort uVar7;
  
  bVar1 = this->ringModulated;
  uVar2 = unlogAndMixWGOutput(&this->master);
  if (bVar1 == false) {
    BVar4 = unlogAndMixWGOutput(&this->slave);
    sVar6 = uVar2 + BVar4;
  }
  else {
    if ((this->slave).pcmWaveAddress == (Bit16s *)0x0) {
      uVar5 = unlogAndMixWGOutput(&this->slave);
    }
    else {
      LVar8.logValue = 0xffff;
      LVar8._2_2_ = 0;
      LVar8.sign = POSITIVE;
      if ((this->slave).active != false) {
        LVar8 = (this->slave).firstPCMLogSample;
      }
      BVar3 = LA32Utilites::interpolateExp(LVar8.logValue & 0xfff);
      uVar7 = BVar3 >> (sbyte)(((ulong)LVar8 & 0xffff) >> 0xc);
      uVar5 = -uVar7;
      if ((ulong)LVar8 >> 0x20 == 0) {
        uVar5 = uVar7;
      }
    }
    uVar7 = 0;
    if (this->mixed != false) {
      uVar7 = uVar2;
    }
    sVar6 = uVar7 + (short)((uint)((int)(short)((short)(uVar5 * 4) >> 0xf & 0xe000U | uVar5 & 0x1fff
                                               ) *
                                  (int)(short)((short)(uVar2 * 4) >> 0xf & 0xe000U | uVar2 & 0x1fff)
                                  ) >> 0xd);
  }
  return sVar6;
}

Assistant:

Bit16s LA32IntPartialPair::nextOutSample() {
	if (!ringModulated) {
		return unlogAndMixWGOutput(master) + unlogAndMixWGOutput(slave);
	}

	Bit16s masterSample = unlogAndMixWGOutput(master); // Store master partial sample for further mixing

	/* SEMI-CONFIRMED from sample analysis:
	 * We observe that for partial structures with ring modulation the interpolation is not applied to the slave PCM partial.
	 * It's assumed that the multiplication circuitry intended to perform the interpolation on the slave PCM partial
	 * is borrowed by the ring modulation circuit (or the LA32 chip has a similar lack of resources assigned to each partial pair).
	 */
	Bit16s slaveSample = slave.isPCMWave() ? LA32Utilites::unlog(slave.getOutputLogSample(true)) : unlogAndMixWGOutput(slave);

	/* SEMI-CONFIRMED: Ring modulation model derived from sample analysis of specially constructed patches which exploit distortion.
	 * LA32 ring modulator found to produce distorted output in case if the absolute value of maximal amplitude of one of the input partials exceeds 8191.
	 * This is easy to reproduce using synth partials with resonance values close to the maximum. It looks like an integer overflow happens in this case.
	 * As the distortion is strictly bound to the amplitude of the complete mixed square + resonance wave in the linear space,
	 * it is reasonable to assume the ring modulation is performed also in the linear space by sample multiplication.
	 * Most probably the overflow is caused by limited precision of the multiplication circuit as the very similar distortion occurs with panning.
	 */
	Bit16s ringModulatedSample = Bit16s((Bit32s(produceDistortedSample(masterSample)) * Bit32s(produceDistortedSample(slaveSample))) >> 13);

	return mixed ? masterSample + ringModulatedSample : ringModulatedSample;
}